

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiOutAlsa::MidiOutAlsa(MidiOutAlsa *this,string *clientName)

{
  MidiOutApi::MidiOutApi(&this->super_MidiOutApi);
  (this->super_MidiOutApi).super_MidiApi._vptr_MidiApi = (_func_int **)&PTR__MidiOutAlsa_00115c40;
  initialize(this,clientName);
  return;
}

Assistant:

MidiOutAlsa :: MidiOutAlsa( const std::string &clientName ) : MidiOutApi()
{
  MidiOutAlsa::initialize( clientName );
}